

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmGeneratorTarget::ComputeTargetManifest(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TargetType TVar4;
  cmGlobalGenerator *this_00;
  string f;
  string realName;
  string name;
  string soName;
  string pdbName;
  string impName;
  string dir;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (this->Target->IsImportedTarget != false) {
    return;
  }
  this_00 = this->LocalGenerator->GlobalGenerator;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  TVar4 = this->Target->TargetTypeValue;
  local_b0._M_dataplus._M_p = (pointer)paVar3;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  if (TVar4 - STATIC_LIBRARY < 3) {
    GetLibraryNames(this,&local_f0,&local_d0,&local_110,&local_90,&local_b0,config);
  }
  else {
    if (TVar4 != EXECUTABLE) goto LAB_00337651;
    GetExecutableNames(this,&local_f0,&local_110,&local_90,&local_b0,config);
  }
  GetDirectory(&local_70,this,config,false);
  paVar1 = &local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_130._M_dataplus._M_p = (pointer)paVar1;
  if (local_f0._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_130);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_f0._M_dataplus._M_p);
    cmGlobalGenerator::AddToManifest(this_00,&local_130);
  }
  if (local_d0._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_130);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_d0._M_dataplus._M_p);
    cmGlobalGenerator::AddToManifest(this_00,&local_130);
  }
  if (local_110._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_130);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_110._M_dataplus._M_p);
    cmGlobalGenerator::AddToManifest(this_00,&local_130);
  }
  if (local_b0._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_130);
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_b0._M_dataplus._M_p);
    cmGlobalGenerator::AddToManifest(this_00,&local_130);
  }
  if (local_90._M_string_length != 0) {
    GetDirectory(&local_50,this,config,true);
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_130);
    std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_90._M_dataplus._M_p);
    cmGlobalGenerator::AddToManifest(this_00,&local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                             local_130.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_00337651:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

bool cmGeneratorTarget::IsImported() const
{
  return this->Target->IsImported();
}